

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_AigDfs(Abc_Ntk_t *pNtk,int fCollectAll,int fCollectCos)

{
  undefined4 uVar1;
  long *plVar2;
  long lVar3;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar4;
  int *piVar5;
  Vec_Ptr_t *vNodes;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  int Fill;
  uint uVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar9;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x4b3,"Vec_Ptr_t *Abc_AigDfs(Abc_Ntk_t *, int, int)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar10 = pNtk->vObjs->nSize;
    uVar9 = (long)iVar10 + 500;
    iVar12 = (int)uVar9;
    if ((pNtk->vTravIds).nCap < iVar12) {
      piVar5 = (int *)malloc(uVar9 * 4);
      (pNtk->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar12;
    }
    if (-500 < iVar10) {
      memset((pNtk->vTravIds).pArray,0,(uVar9 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar10 = pNtk->nTravIds;
  pNtk->nTravIds = iVar10 + 1;
  if (0x3ffffffe < iVar10) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vNodes->pArray = ppvVar6;
  pVVar7 = pNtk->vCos;
  uVar9 = extraout_RDX;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar11];
      Abc_AigDfs_rec(*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8),
                     vNodes);
      lVar3 = *plVar2;
      uVar1 = *(undefined4 *)(lVar3 + 0xd8);
      iVar10 = (int)plVar2[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar10 + 1,Fill);
      if (((long)iVar10 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar3 + 0xe8) + (long)iVar10 * 4) = uVar1;
      uVar9 = extraout_RDX_00;
      if (fCollectCos != 0) {
        uVar8 = vNodes->nCap;
        if (vNodes->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
            }
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar8 * 2;
            if (iVar10 <= (int)uVar8) goto LAB_001c4ae8;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar8 << 4);
            }
          }
          vNodes->pArray = ppvVar6;
          vNodes->nCap = iVar10;
        }
LAB_001c4ae8:
        iVar10 = vNodes->nSize;
        uVar8 = iVar10 + 1;
        uVar9 = (ulong)uVar8;
        vNodes->nSize = uVar8;
        vNodes->pArray[iVar10] = plVar2;
      }
      lVar11 = lVar11 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar11 < pVVar7->nSize);
  }
  if ((fCollectAll != 0) && (pVVar7 = pNtk->vObjs, 0 < pVVar7->nSize)) {
    lVar11 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar7->pArray[lVar11];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        pAVar4 = pNode->pNtk;
        iVar10 = pNode->Id;
        Vec_IntFillExtra(&pAVar4->vTravIds,iVar10 + 1,(int)uVar9);
        if (((long)iVar10 < 0) || ((pAVar4->vTravIds).nSize <= iVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar9 = extraout_RDX_01;
        if ((pAVar4->vTravIds).pArray[iVar10] != pNode->pNtk->nTravIds) {
          Abc_AigDfs_rec(pNode,vNodes);
          uVar9 = extraout_RDX_02;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar11 < pVVar7->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_AigDfs( Abc_Ntk_t * pNtk, int fCollectAll, int fCollectCos )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        if ( fCollectCos )
            Vec_PtrPush( vNodes, pNode );
    }
    // collect dangling nodes if asked to
    if ( fCollectAll )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_NodeIsTravIdCurrent(pNode) )
                Abc_AigDfs_rec( pNode, vNodes );
    }
    return vNodes;
}